

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O2

void Abc_NtkLogicMakeSimpleCosTest(Abc_Ntk_t *pNtk,int fDuplicate)

{
  uint *puVar1;
  int *piVar2;
  uint uVar3;
  void *__ptr;
  Abc_Obj_t *pAVar4;
  ulong uVar5;
  uint uVar6;
  long lVar7;
  int i;
  ulong uVar8;
  int Inputs [2];
  int Consts [2];
  int Counts [4];
  
  uVar3 = pNtk->vObjs->nSize;
  __ptr = calloc((long)(int)uVar3,4);
  Consts[0] = 0;
  Consts[1] = 0;
  Inputs[0] = 0;
  Inputs[1] = 0;
  Counts[0] = 0;
  Counts[1] = 0;
  Counts[2] = 0;
  Counts[3] = 0;
  for (i = 0; i < pNtk->vCos->nSize; i = i + 1) {
    pAVar4 = Abc_NtkCo(pNtk,i);
    lVar7 = (long)*(pAVar4->vFanins).pArray;
    if (lVar7 == 0) {
      piVar2 = (int *)((long)Consts + (ulong)(*(uint *)&pAVar4->field_0x14 >> 8 & 4));
      *piVar2 = *piVar2 + 1;
    }
    uVar6 = *(uint *)((long)pAVar4->pNtk->vObjs->pArray[lVar7] + 0x14) & 0xf;
    if ((uVar6 == 2) || (uVar6 == 5)) {
      uVar8 = (ulong)(*(uint *)&pAVar4->field_0x14 >> 10 & 1);
      Inputs[uVar8] = Inputs[uVar8] + 1;
    }
    else {
      uVar8 = (ulong)(*(uint *)&pAVar4->field_0x14 >> 10 & 1);
    }
    puVar1 = (uint *)((long)__ptr + lVar7 * 4);
    *puVar1 = *puVar1 | 1 << (sbyte)uVar8;
  }
  uVar5 = 0;
  uVar8 = (ulong)uVar3;
  if ((int)uVar3 < 1) {
    uVar8 = uVar5;
  }
  for (; uVar8 != uVar5; uVar5 = uVar5 + 1) {
    Counts[*(uint *)((long)__ptr + uVar5 * 4)] = Counts[*(uint *)((long)__ptr + uVar5 * 4)] + 1;
  }
  for (uVar8 = 0; uVar8 != 4; uVar8 = uVar8 + 1) {
    printf("%d = %d     ",uVar8 & 0xffffffff,(ulong)(uint)Counts[uVar8]);
  }
  for (uVar8 = 0; uVar8 != 2; uVar8 = uVar8 + 1) {
    printf("c%d = %d     ",uVar8 & 0xffffffff,(ulong)(uint)Consts[uVar8]);
  }
  for (uVar8 = 0; uVar8 != 2; uVar8 = uVar8 + 1) {
    printf("i%d = %d    ",uVar8 & 0xffffffff,(ulong)(uint)Inputs[uVar8]);
  }
  putchar(10);
  free(__ptr);
  return;
}

Assistant:

void Abc_NtkLogicMakeSimpleCosTest( Abc_Ntk_t * pNtk, int fDuplicate )
{
    int nObjs = Abc_NtkObjNumMax(pNtk);
    unsigned * pType = ABC_CALLOC( unsigned, nObjs );
    Abc_Obj_t * pNode;
    int i, Counts[4] = {0}, Consts[2] = {0}, Inputs[2] = {0};
    // collect info
    Abc_NtkForEachCo( pNtk, pNode, i ) 
    {
        if ( Abc_ObjFaninId0(pNode) == 0 )
            Consts[Abc_ObjFaninC0(pNode)]++;
        if ( Abc_ObjIsCi(Abc_ObjFanin0(pNode)) )
            Inputs[Abc_ObjFaninC0(pNode)]++;
        pType[Abc_ObjFaninId0(pNode)] |= (1 << Abc_ObjFaninC0(pNode));
    }
    // count the numbers
    for ( i = 0; i < nObjs; i++ )
        Counts[pType[i]]++;
    for ( i = 0; i < 4; i++ )
        printf( "%d = %d     ", i, Counts[i] );
    for ( i = 0; i < 2; i++ )
        printf( "c%d = %d     ", i, Consts[i] );
    for ( i = 0; i < 2; i++ )
        printf( "i%d = %d    ", i, Inputs[i] );
    printf( "\n" );
    ABC_FREE( pType );
}